

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_yield_distribution.cpp
# Opt level: O1

void __thiscall
particle_yield_distribution::collect_particle_yield(particle_yield_distribution *this,int event_id)

{
  double dVar1;
  vector<particle_info,_std::allocator<particle_info>_> *pvVar2;
  long lVar3;
  ostream *poVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  
  pvVar2 = (((this->particle_list).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->particle_list->
           super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
           )._M_impl.super__Vector_impl_data._M_start[event_id];
  uVar8 = (int)((long)*(pointer *)
                       ((long)&pvVar2->
                               super__Vector_base<particle_info,_std::allocator<particle_info>_> + 8
                       ) -
                *(long *)&pvVar2->super__Vector_base<particle_info,_std::allocator<particle_info>_>
               >> 3) * -0x11111111;
  iVar6 = 0;
  if (0 < (int)uVar8) {
    uVar9 = (ulong)(uVar8 & 0x7fffffff);
    lVar7 = 0;
    iVar6 = 0;
    do {
      lVar3 = *(long *)&(((this->particle_list).
                          super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         particle_list->
                        super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                        )._M_impl.super__Vector_impl_data._M_start[event_id]->
                        super__Vector_base<particle_info,_std::allocator<particle_info>_>;
      dVar11 = *(double *)(lVar3 + 0x28 + lVar7);
      dVar10 = *(double *)(lVar3 + 0x30 + lVar7);
      if (this->rap_type == 0) {
        dVar1 = *(double *)(lVar3 + 8 + lVar7);
        dVar10 = dVar10 * dVar10 - dVar1 * dVar1;
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
        }
        else {
          dVar10 = SQRT(dVar10);
        }
      }
      dVar11 = log((dVar11 + dVar10) / (dVar10 - dVar11));
      dVar11 = dVar11 * 0.5;
      if ((this->rap_min <= dVar11 && dVar11 != this->rap_min) && (dVar11 < this->rap_max)) {
        lVar3 = *(long *)&(((this->particle_list).
                            super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->particle_list->
                          super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                          )._M_impl.super__Vector_impl_data._M_start[event_id]->
                          super__Vector_base<particle_info,_std::allocator<particle_info>_>;
        dVar11 = *(double *)(lVar3 + 0x18 + lVar7);
        dVar10 = *(double *)(lVar3 + 0x20 + lVar7);
        dVar11 = dVar11 * dVar11 + dVar10 * dVar10;
        if (dVar11 < 0.0) {
          dVar11 = sqrt(dVar11);
        }
        else {
          dVar11 = SQRT(dVar11);
        }
        iVar6 = iVar6 + (uint)(dVar11 < this->pT_max && this->pT_min < dVar11);
      }
      lVar7 = lVar7 + 0x78;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  iVar5 = 0;
  if ((this->net_particle_flag == 1) &&
     (pvVar2 = (((this->particle_list).
                 super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                anti_particle_list->
               super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
               )._M_impl.super__Vector_impl_data._M_start[event_id],
     uVar8 = (int)((long)*(pointer *)
                          ((long)&pvVar2->
                                  super__Vector_base<particle_info,_std::allocator<particle_info>_>
                          + 8) -
                   *(long *)&pvVar2->
                             super__Vector_base<particle_info,_std::allocator<particle_info>_> >> 3)
             * -0x11111111, iVar5 = 0, 0 < (int)uVar8)) {
    uVar9 = (ulong)(uVar8 & 0x7fffffff);
    lVar7 = 0;
    iVar5 = 0;
    do {
      lVar3 = *(long *)&(((this->particle_list).
                          super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         anti_particle_list->
                        super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                        )._M_impl.super__Vector_impl_data._M_start[event_id]->
                        super__Vector_base<particle_info,_std::allocator<particle_info>_>;
      dVar11 = *(double *)(lVar3 + 0x28 + lVar7);
      dVar10 = *(double *)(lVar3 + 0x30 + lVar7);
      if (this->rap_type == 0) {
        dVar1 = *(double *)(lVar3 + 8 + lVar7);
        dVar10 = dVar10 * dVar10 - dVar1 * dVar1;
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
        }
        else {
          dVar10 = SQRT(dVar10);
        }
      }
      dVar11 = log((dVar11 + dVar10) / (dVar10 - dVar11));
      dVar11 = dVar11 * 0.5;
      if ((this->rap_min <= dVar11 && dVar11 != this->rap_min) && (dVar11 < this->rap_max)) {
        lVar3 = *(long *)&(((this->particle_list).
                            super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->anti_particle_list->
                          super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                          )._M_impl.super__Vector_impl_data._M_start[event_id]->
                          super__Vector_base<particle_info,_std::allocator<particle_info>_>;
        dVar11 = *(double *)(lVar3 + 0x18 + lVar7);
        dVar10 = *(double *)(lVar3 + 0x20 + lVar7);
        dVar11 = dVar11 * dVar11 + dVar10 * dVar10;
        if (dVar11 < 0.0) {
          dVar11 = sqrt(dVar11);
        }
        else {
          dVar11 = SQRT(dVar11);
        }
        iVar5 = iVar5 + (uint)(dVar11 < this->pT_max && this->pT_min < dVar11);
      }
      lVar7 = lVar7 + 0x78;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  uVar8 = this->n_max / 2 + (iVar6 - iVar5);
  if ((-1 < (int)uVar8) && ((int)uVar8 < this->n_max)) {
    this->number_of_events[uVar8] = this->number_of_events[uVar8] + 1;
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"particle number is out of bound!");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"bound: [");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,-(this->n_max / 2));
  poVar4 = std::operator<<(poVar4," , ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->n_max / 2);
  poVar4 = std::operator<<(poVar4,"]");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"count = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar6);
  poVar4 = std::operator<<(poVar4,", count_anti_particle = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
  std::endl<char,std::char_traits<char>>(poVar4);
  exit(1);
}

Assistant:

void particle_yield_distribution::collect_particle_yield(int event_id) {
    int number_of_particles = particle_list->get_number_of_particles(event_id);

    int count = 0;
    for (int i = 0; i < number_of_particles; i++) {
        double pz_local = particle_list->get_particle(event_id, i).pz;
        double E_local = particle_list->get_particle(event_id, i).E;

        double rap_local;
        if (rap_type == 0) {
            double mass = particle_list->get_particle(event_id, i).mass;
            double pmag = sqrt(E_local * E_local - mass * mass);
            rap_local = 0.5 * log((pmag + pz_local) / (pmag - pz_local));
        } else {
            rap_local = 0.5 * log((E_local + pz_local) / (E_local - pz_local));
        }

        if (rap_local > rap_min && rap_local < rap_max) {
            double px_local = particle_list->get_particle(event_id, i).px;
            double py_local = particle_list->get_particle(event_id, i).py;
            double p_perp = sqrt(px_local * px_local + py_local * py_local);
            if (p_perp > pT_min && p_perp < pT_max) {
                count++;
            }
        }
    }
    int count_anti_particle = 0;
    if (net_particle_flag == 1) {
        int number_of_anti_particles =
            particle_list->get_number_of_anti_particles(event_id);
        for (int i = 0; i < number_of_anti_particles; i++) {
            double pz_local = particle_list->get_anti_particle(event_id, i).pz;
            double E_local = particle_list->get_anti_particle(event_id, i).E;

            double rap_local;
            if (rap_type == 0) {
                double mass =
                    particle_list->get_anti_particle(event_id, i).mass;
                double pmag = sqrt(E_local * E_local - mass * mass);
                rap_local = 0.5 * log((pmag + pz_local) / (pmag - pz_local));
            } else {
                rap_local =
                    0.5 * log((E_local + pz_local) / (E_local - pz_local));
            }

            if (rap_local > rap_min && rap_local < rap_max) {
                double px_local =
                    particle_list->get_anti_particle(event_id, i).px;
                double py_local =
                    particle_list->get_anti_particle(event_id, i).py;
                double p_perp = sqrt(px_local * px_local + py_local * py_local);
                if (p_perp > pT_min && p_perp < pT_max) {
                    count_anti_particle++;
                }
            }
        }
    }
    int idx = count - count_anti_particle + n_max / 2;
    if (idx < 0 || idx > n_max - 1) {
        cout << "particle number is out of bound!" << endl;
        cout << "bound: [" << -n_max / 2 << " , " << n_max / 2 << "]" << endl;
        cout << "count = " << count
             << ", count_anti_particle = " << count_anti_particle << endl;
        exit(1);
    }
    number_of_events[idx]++;
}